

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values_linear.c
# Opt level: O0

void mpt_values_linear(long points,double *target,long ld,double min,double max)

{
  long lVar1;
  double dv;
  long len;
  long i;
  double max_local;
  double min_local;
  long ld_local;
  double *target_local;
  long points_local;
  
  if ((target != (double *)0x0) && (0 < points)) {
    lVar1 = points + -1;
    *target = min;
    for (len = 1; len < lVar1; len = len + 1) {
      target[len * ld] = (double)len * ((max - min) / (double)lVar1) + min;
    }
    target[lVar1 * ld] = max;
  }
  return;
}

Assistant:

extern void mpt_values_linear(long points, double *target, long ld, double min, double max)
{
	long i, len;
	double dv;
	
	if (!target || points < 1) {
		return;
	}
	dv = (max - min) / (len = points - 1);
	
	target[0] = min;
	
	for (i = 1; i < len; i++) {
		target[i * ld] = min + i * dv;
	}
	target[len * ld] = max;
}